

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O1

void setup_mem(MIR_mem_t mem,int *mod,int *rm,int *scale,int *base,int *rex_b,int *index,int *rex_x,
              int *disp8,int64_t *disp32)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  uint uVar5;
  
  if (((-1 < *disp8) || (-1 < *disp32)) || (mem.index == 4)) {
    __assert_fail("*disp8 < 0 && *disp32 < 0 && mem.index != SP_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x891,
                  "void setup_mem(MIR_mem_t, int *, int *, int *, int *, int *, int *, int *, int *, int64_t *)"
                 );
  }
  if ((mem.index & mem.base) == 0xffffffff) {
    if (*rm < 0) {
      *rm = 4;
      *disp32 = mem.disp & 0xffffffff;
      if ((*base < 0) && (*base = 5, *index < 0)) {
        *index = 4;
        return;
      }
    }
    goto LAB_00175cef;
  }
  uVar5 = mem.base & 0xfffffff7;
  cVar4 = (char)mem.disp;
  uVar3 = (uint)mem.disp;
  if (uVar5 == 4 || mem.index != 0xffffffff) {
    iVar1 = *rm;
    if (mem.index != 0xffffffff) {
      if (mem.base == 0xffffffff) {
        if (iVar1 < 0) {
          *rm = 4;
          setup_r(rex_x,index,mem.index);
          if (*base < 0) {
            *base = 5;
            if (-1 < *mod) goto LAB_00175d0e;
            *mod = 0;
            *disp32 = mem.disp & 0xffffffff;
            if (mem.scale == '\x01') {
              uVar3 = 0;
            }
            else if (mem.scale == '\x02') {
              uVar3 = 1;
            }
            else {
              uVar3 = mem.scale == '\x04' ^ 3;
            }
            if (*scale < 0) {
              *scale = uVar3;
              return;
            }
            goto LAB_00175d2d;
          }
        }
LAB_00175cef:
        __assert_fail("(rex == ((void*)0) || *rex < 0) && *r < 0 && v >= 0 && v <= ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x85d,"void setup_r(int *, int *, int)");
      }
      if (-1 < iVar1) goto LAB_00175cef;
      *rm = 4;
      setup_r(rex_b,base,mem.base);
      setup_r(rex_x,index,mem.index);
      if (mem.scale == '\x01') {
        uVar2 = 0;
      }
      else if (mem.scale == '\x02') {
        uVar2 = 1;
      }
      else {
        uVar2 = mem.scale == '\x04' ^ 3;
      }
      if (-1 < *scale) {
LAB_00175d2d:
        __assert_fail("*scale < 0 && v >= 0 && v <= 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x87d,"void setup_scale(int *, int)");
      }
      *scale = uVar2;
      if (uVar5 != 5 && mem.disp == 0) {
        if (*mod < 0) {
          *mod = 0;
          return;
        }
        goto LAB_00175d0e;
      }
      if (cVar4 == mem.disp) {
        if (*mod < 0) {
          *mod = 1;
          *disp8 = uVar3 & 0xff;
          return;
        }
        goto LAB_00175d0e;
      }
      if (-1 < *mod) goto LAB_00175d0e;
      *mod = 2;
      goto LAB_00175c72;
    }
    if ((-1 < iVar1) || (*rm = 4, -1 < *index)) goto LAB_00175cef;
    *index = 4;
    setup_r(rex_b,base,mem.base);
    if (mem.disp == 0) goto LAB_00175b82;
    iVar1 = *mod;
    if (cVar4 == mem.disp) {
      if (iVar1 < 0) {
        *mod = 1;
        *disp8 = uVar3 & 0xff;
        return;
      }
      goto LAB_00175d0e;
    }
  }
  else {
    setup_r(rex_b,rm,mem.base);
    if (uVar5 != 5 && mem.disp == 0) {
LAB_00175b82:
      if (*mod < 0) {
        *mod = 0;
        return;
      }
      goto LAB_00175d0e;
    }
    iVar1 = *mod;
    if (cVar4 == mem.disp) {
      if (iVar1 < 0) {
        *mod = 1;
        *disp8 = uVar3 & 0xff;
        return;
      }
      goto LAB_00175d0e;
    }
  }
  if (iVar1 < 0) {
    *mod = 2;
LAB_00175c72:
    *disp32 = mem.disp & 0xffffffff;
    return;
  }
LAB_00175d0e:
  __assert_fail("*mod < 0 && v >= 0 && v <= 3",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x878,"void setup_mod(int *, int)");
}

Assistant:

static void setup_mem (MIR_mem_t mem, int *mod, int *rm, int *scale, int *base, int *rex_b,
                       int *index, int *rex_x, int *disp8, int64_t *disp32) {
  MIR_disp_t disp = mem.disp;

  gen_assert (*disp8 < 0 && *disp32 < 0 && mem.index != SP_HARD_REG);
  if (mem.index == MIR_NON_VAR && mem.base == MIR_NON_VAR) { /* SIB: disp only */
    setup_rm (NULL, rm, 4);
    *disp32 = (uint32_t) disp;
    setup_base (NULL, base, BP_HARD_REG);
    setup_index (NULL, index, SP_HARD_REG);
  } else if (mem.index == MIR_NON_VAR && mem.base != SP_HARD_REG && mem.base != R12_HARD_REG) {
    setup_rm (rex_b, rm, mem.base);
    if (disp == 0 && mem.base != BP_HARD_REG && mem.base != R13_HARD_REG) {
      setup_mod (mod, 0);
    } else if (int8_p (disp)) {
      setup_mod (mod, 1);
      *disp8 = (uint8_t) disp;
    } else {
      setup_mod (mod, 2);
      *disp32 = (uint32_t) disp;
    }
  } else if (mem.index == MIR_NON_VAR) { /* SIB: only base = sp or r12 */
    setup_rm (NULL, rm, 4);
    setup_index (NULL, index, SP_HARD_REG);
    setup_base (rex_b, base, mem.base);
    if (disp == 0) {
      setup_mod (mod, 0);
    } else if (int8_p (disp)) {
      setup_mod (mod, 1);
      *disp8 = (uint8_t) disp;
    } else {
      setup_mod (mod, 2);
      *disp32 = (uint32_t) disp;
    }
  } else if (mem.base == MIR_NON_VAR) { /* SIB: index with scale only */
    setup_rm (NULL, rm, 4);
    setup_index (rex_x, index, mem.index);
    setup_base (NULL, base, BP_HARD_REG);
    setup_mod (mod, 0);
    *disp32 = (uint32_t) disp;
    setup_scale (scale, mem.scale == 1 ? 0 : mem.scale == 2 ? 1 : mem.scale == 4 ? 2 : 3);
  } else { /* SIB: base and index */
    setup_rm (NULL, rm, 4);
    setup_base (rex_b, base, mem.base);
    setup_index (rex_x, index, mem.index);
    setup_scale (scale, mem.scale == 1 ? 0 : mem.scale == 2 ? 1 : mem.scale == 4 ? 2 : 3);
    if (disp == 0 && mem.base != BP_HARD_REG && mem.base != R13_HARD_REG) {
      setup_mod (mod, 0);
    } else if (int8_p (disp)) {
      setup_mod (mod, 1);
      *disp8 = (uint8_t) disp;
    } else {
      setup_mod (mod, 2);
      *disp32 = (uint32_t) disp;
    }
  }
}